

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.h
# Opt level: O1

void __thiscall
fmt::v11::detail::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (begin != end) {
    do {
      uVar4 = (long)end - (long)begin;
      if ((long)uVar4 < 0) {
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O1/_deps/fmt-src/include/fmt/base.h"
                    ,0x1b6,"negative value");
      }
      uVar3 = this->size_ + uVar4;
      if (this->capacity_ < uVar3) {
        (*this->grow_)(this,uVar3);
      }
      sVar1 = this->size_;
      uVar3 = this->capacity_ - sVar1;
      if (uVar4 <= uVar3) {
        uVar3 = uVar4;
      }
      if (uVar3 != 0) {
        pcVar2 = this->ptr_;
        uVar4 = 0;
        do {
          pcVar2[uVar4 + sVar1] = begin[uVar4];
          uVar4 = uVar4 + 1;
        } while (uVar3 != uVar4);
      }
      this->size_ = this->size_ + uVar3;
      begin = begin + uVar3;
    } while (begin != end);
  }
  return;
}

Assistant:

void
      append(const U* begin, const U* end) {
    while (begin != end) {
      auto count = to_unsigned(end - begin);
      try_reserve(size_ + count);
      auto free_cap = capacity_ - size_;
      if (free_cap < count) count = free_cap;
      // A loop is faster than memcpy on small sizes.
      T* out = ptr_ + size_;
      for (size_t i = 0; i < count; ++i) out[i] = begin[i];
      size_ += count;
      begin += count;
    }
  }